

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_memory_editor.h
# Opt level: O0

void * MemoryEditor::EndianessCopyBigEndian(void *_dst,void *_src,size_t s,int is_little_endian)

{
  int local_44;
  int n;
  int i;
  uint8_t *src;
  uint8_t *dst;
  int is_little_endian_local;
  size_t s_local;
  void *_src_local;
  void *_dst_local;
  
  if (is_little_endian == 0) {
    memcpy(_dst,_src,s);
  }
  else {
    _n = (uint8_t *)((long)_src + s);
    src = (uint8_t *)_dst;
    for (local_44 = 0; _n = _n + -1, local_44 < (int)s; local_44 = local_44 + 1) {
      *src = *_n;
      src = src + 1;
    }
  }
  return _dst;
}

Assistant:

static void* EndianessCopyBigEndian(void* _dst, void* _src, size_t s, int is_little_endian)
    {
        if (is_little_endian)
        {
            uint8_t* dst = (uint8_t*)_dst;
            uint8_t* src = (uint8_t*)_src + s - 1;
            for (int i = 0, n = (int)s; i < n; ++i)
                memcpy(dst++, src--, 1);
            return _dst;
        }
        else
        {
            return memcpy(_dst, _src, s);
        }
    }